

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O2

bool __thiscall QFileDevice::seek(QFileDevice *this,qint64 off)

{
  QFileDevicePrivate *this_00;
  QAbstractFileEngine *pQVar1;
  bool bVar2;
  int iVar3;
  FileError FVar4;
  FileError FVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileDevicePrivate *)
            (this->super_QIODevice).d_ptr._M_t.
            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
            super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  bVar2 = QIODevice::isOpen(&this->super_QIODevice);
  if (bVar2) {
    bVar2 = QFileDevicePrivate::ensureFlushed(this_00);
    if (bVar2) {
      pQVar1 = (this_00->fileEngine)._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
      iVar3 = (*pQVar1->_vptr_QAbstractFileEngine[8])(pQVar1,off);
      if ((char)iVar3 != '\0') {
        bVar2 = QIODevice::seek(&this->super_QIODevice,off);
        if (bVar2) {
          unsetError(this);
          bVar2 = true;
          goto LAB_0010c1c9;
        }
      }
      FVar4 = QAbstractFileEngine::error
                        ((this_00->fileEngine)._M_t.
                         super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                         .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl);
      FVar5 = PositionError;
      if (FVar4 != UnspecifiedError) {
        FVar5 = FVar4;
      }
      QAbstractFileEngine::errorString
                ((QString *)&local_40,
                 (this_00->fileEngine)._M_t.
                 super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                 .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl);
      ((FileHandleFlags *)&this_00->error)->
      super_QFlagsStorageHelper<QFileDevice::FileHandleFlag,_4> =
           (QFlagsStorageHelper<QFileDevice::FileHandleFlag,_4>)FVar5;
      QString::operator=(&(this_00->super_QIODevicePrivate).errorString,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    }
  }
  bVar2 = false;
LAB_0010c1c9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDevice::seek(qint64 off)
{
    Q_D(QFileDevice);
    if (!isOpen()) {
        qWarning("QFileDevice::seek: IODevice is not open");
        return false;
    }

    if (!d->ensureFlushed())
        return false;

    if (!d->fileEngine->seek(off) || !QIODevice::seek(off)) {
        QFileDevice::FileError err = d->fileEngine->error();
        if (err == QFileDevice::UnspecifiedError)
            err = QFileDevice::PositionError;
        d->setError(err, d->fileEngine->errorString());
        return false;
    }
    unsetError();
    return true;
}